

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,vector3d *value)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_38 [8];
  double3 v;
  vector3d *value_local;
  AsciiParser *this_local;
  
  v._M_elems[2] = (double)value;
  bVar1 = ParseBasicTypeTuple<double,3ul>(this,(array<double,_3UL> *)local_38);
  if (bVar1) {
    pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_38,0);
    *(value_type_conflict1 *)v._M_elems[2] = *pvVar2;
    pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_38,1);
    *(value_type_conflict1 *)((long)v._M_elems[2] + 8) = *pvVar2;
    pvVar2 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_38,2);
    *(value_type_conflict1 *)((long)v._M_elems[2] + 0x10) = *pvVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::vector3d *value) {
  value::double3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->x = v[0];
    value->y = v[1];
    value->z = v[2];
    return true;
  }
  return false;
}